

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

double __thiscall soinn::ESOINN::getSimilarityThreshold(ESOINN *this,Vertex *vertex)

{
  bool bVar1;
  type_conflict1 tVar2;
  degree_size_type dVar3;
  reference ppvVar4;
  vertex_bundled *pvVar5;
  vertex_bundled *pvVar6;
  reference v;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
  *in_RCX;
  _List_node_base *p_Var7;
  type local_f0;
  _List_node_base *local_d8;
  double distCurrent_1;
  pair<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>_>
  local_c0;
  undefined1 local_90 [8];
  AdjacencyIterator end_1;
  AdjacencyIterator current_1;
  double distCurrent;
  pair<std::_List_iterator<void_*>,_std::_List_iterator<void_*>_> local_40;
  _List_iterator<void_*> local_30;
  VertexIterator end;
  VertexIterator current;
  double dist;
  Vertex *vertex_local;
  ESOINN *this_local;
  
  dVar3 = boost::
          out_degree<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                    (*vertex,(adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                              *)&this->graph);
  if (dVar3 == 0) {
    current._M_node = (_List_node_base *)std::numeric_limits<double>::max();
    std::_List_iterator<void_*>::_List_iterator(&end);
    std::_List_iterator<void_*>::_List_iterator(&local_30);
    local_40 = boost::
               vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
                         ((adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>::config>_>
                           *)&this->graph);
    boost::tuples::tie<std::_List_iterator<void*>,std::_List_iterator<void*>>
              ((tuples *)&distCurrent,&end,&local_30);
    boost::tuples::
    tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
    ::operator=((tuple<std::_List_iterator<void*>&,std::_List_iterator<void*>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                 *)&distCurrent,&local_40);
    while (bVar1 = std::operator!=(&end,&local_30), bVar1) {
      ppvVar4 = std::_List_iterator<void_*>::operator*(&end);
      if (*ppvVar4 != *vertex) {
        pvVar5 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 ::operator[](&this->graph,*vertex);
        ppvVar4 = std::_List_iterator<void_*>::operator*(&end);
        pvVar6 = boost::
                 adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
                 ::operator[](&this->graph,*ppvVar4);
        p_Var7 = (_List_node_base *)distance(this,&pvVar5->weight,&pvVar6->weight);
        if ((double)p_Var7 < (double)current._M_node) {
          current._M_node = p_Var7;
        }
      }
      std::_List_iterator<void_*>::operator++(&end,0);
    }
  }
  else {
    current._M_node = (_List_node_base *)std::numeric_limits<double>::min();
    boost::
    adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
    ::adjacency_iterator
              ((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
                *)&end_1.m_g);
    boost::
    adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
    ::adjacency_iterator
              ((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
                *)local_90);
    boost::
    adjacent_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>::config>>
              (&local_c0,(boost *)*vertex,&this->graph,in_RCX);
    boost::tuples::
    tie<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>>
              ((tuples *)&distCurrent_1,
               (adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
                *)&end_1.m_g,
               (adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>
                *)local_90);
    boost::tuples::
    tuple<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
    ::operator=((tuple<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,void*,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void*,std::_List_iterator<boost::list_edge<void*,soinn::EdgeProperties>>,soinn::EdgeProperties>>,void*,boost::detail::edge_desc_impl<boost::undirected_tag,void*>,long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
                 *)&distCurrent_1,&local_c0);
    while (tVar2 = boost::iterators::operator!=
                             ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                               *)&end_1.m_g,
                              (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                               *)local_90), tVar2) {
      pvVar5 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,*vertex);
      v = boost::iterators::detail::
          iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
          ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                       *)&end_1.m_g);
      pvVar6 = boost::
               adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
               ::operator[](&this->graph,v);
      local_d8 = (_List_node_base *)distance(this,&pvVar5->weight,&pvVar6->weight);
      if ((double)current._M_node < (double)local_d8) {
        current._M_node = local_d8;
      }
      boost::iterators::operator++
                (&local_f0,
                 (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_soinn::EdgeProperties>_>,_soinn::EdgeProperties>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                  *)&end_1.m_g,0);
    }
  }
  return (double)current._M_node;
}

Assistant:

double ESOINN::getSimilarityThreshold(const Vertex& vertex)
{
    double dist = 0.0;
    if(!boost::out_degree(vertex, graph))
    {
        dist = std::numeric_limits<double>::max();
        VertexIterator current, end;
        boost::tie(current, end) = boost::vertices(graph);
        for(; current != end; current++)
        {
            if(*current != vertex)
            {
                double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
                if(distCurrent < dist)
                {
                    dist = distCurrent;
                }
            }
        }
    }
    else
    {
        dist = std::numeric_limits<double>::min();
        AdjacencyIterator current, end;
        boost::tie(current, end) = boost::adjacent_vertices(vertex, graph);
        for(; current != end; current++)
        {
            double distCurrent = distance(graph[vertex].weight, graph[*current].weight);
            if(distCurrent > dist)
            {
                dist = distCurrent;
            }
        }
    }
    return dist;
}